

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

bool __thiscall Options::Parse(Options *this,int argc,char **argv)

{
  pointer *ppoVar1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  _Base_ptr p_Var3;
  int iVar4;
  size_t sVar5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  char *__s;
  bool bVar9;
  long *local_78 [2];
  long local_68 [2];
  option local_58;
  
  local_58.flag = (int *)0x0;
  local_58.val = 0;
  local_58._28_4_ = 0;
  local_58.name = (char *)0x0;
  local_58.has_arg = 0;
  local_58._12_4_ = 0;
  __position._M_current =
       (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<option,_std::allocator<option>_>::_M_realloc_insert<option>
              (&this->options,__position,&local_58);
  }
  else {
    (__position._M_current)->flag = (int *)0x0;
    *(undefined8 *)&(__position._M_current)->val = 0;
    (__position._M_current)->name = (char *)0x0;
    *(undefined8 *)&(__position._M_current)->has_arg = 0;
    ppoVar1 = &(this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppoVar1 = *ppoVar1 + 1;
  }
  iVar4 = getopt_long(argc,argv,(this->optstr)._M_dataplus._M_p,
                      (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
                      super__Vector_impl_data._M_start,0);
  local_58.name = (char *)CONCAT44(local_58.name._4_4_,iVar4);
  bVar9 = iVar4 == -1;
  if (!bVar9) {
    p_Var2 = &(this->setters)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var3 = (this->setters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var2->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < iVar4]) {
        if (iVar4 <= (int)*(size_t *)(p_Var3 + 1)) {
          p_Var7 = p_Var3;
        }
      }
      p_Var8 = p_Var2;
      if (((_Rb_tree_header *)p_Var7 != p_Var2) &&
         (p_Var8 = (_Rb_tree_header *)p_Var7,
         iVar4 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var8 = p_Var2;
      }
      if (p_Var8 == p_Var2) {
        return bVar9;
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->was_set,(int *)&local_58);
      __s = _optarg;
      if (_optarg == (char *)0x0) {
        __s = "";
      }
      local_78[0] = local_68;
      sVar5 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,__s,__s + sVar5);
      if (*(long *)((long)(p_Var8 + 1) + 0x10) == 0) {
        uVar6 = std::__throw_bad_function_call();
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        _Unwind_Resume(uVar6);
      }
      (**(code **)((long)(p_Var8 + 1) + 0x18))(p_Var8 + 1,(string *)local_78);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      iVar4 = getopt_long(argc,argv,(this->optstr)._M_dataplus._M_p,
                          (this->options).super__Vector_base<option,_std::allocator<option>_>.
                          _M_impl.super__Vector_impl_data._M_start,0);
      local_58.name = (char *)CONCAT44(local_58.name._4_4_,iVar4);
      bVar9 = iVar4 == -1;
    } while (!bVar9);
  }
  return bVar9;
}

Assistant:

inline bool Options::Parse(int argc, char** argv) {
    this->options.push_back({0, 0, 0, 0});
    int ch;
    while ((ch = getopt_long(argc, argv, this->optstr.c_str(), &this->options[0], NULL)) != -1) {
        auto it = this->setters.find(ch);
        if (it != this->setters.end()) {
            this->was_set.insert(ch);
            it->second(optarg ? optarg : "");
        } else {
            return false;
        }
    }
    return true;
}